

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_semaphore_init(int initialValue,ma_semaphore *pSemaphore)

{
  int e;
  ma_result mVar1;
  
  if (pSemaphore == (ma_semaphore *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                  ,0x2a4b,"ma_result ma_semaphore_init(int, ma_semaphore *)");
  }
  pSemaphore->value = initialValue;
  e = pthread_mutex_init((pthread_mutex_t *)&pSemaphore->lock,(pthread_mutexattr_t *)0x0);
  if (e == 0) {
    e = pthread_cond_init((pthread_cond_t *)&pSemaphore->cond,(pthread_condattr_t *)0x0);
    if (e == 0) {
      return 0;
    }
    pthread_mutex_destroy((pthread_mutex_t *)&pSemaphore->lock);
  }
  mVar1 = ma_result_from_errno(e);
  return mVar1;
}

Assistant:

MA_API ma_result ma_semaphore_init(int initialValue, ma_semaphore* pSemaphore)
{
    if (pSemaphore == NULL) {
        MA_ASSERT(MA_FALSE);    /* Fire an assert so the caller is aware of this bug. */
        return MA_INVALID_ARGS;
    }

#ifdef MA_WIN32
    return ma_semaphore_init__win32(initialValue, pSemaphore);
#endif
#ifdef MA_POSIX
    return ma_semaphore_init__posix(initialValue, pSemaphore);
#endif
}